

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

void yaml_token_delete(yaml_token_t *token)

{
  yaml_token_type_t yVar1;
  long lStack_10;
  
  if (token == (yaml_token_t *)0x0) {
    __assert_fail("token",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x24a,"void yaml_token_delete(yaml_token_t *)");
  }
  yVar1 = token->type;
  if (yVar1 < (YAML_TAG_TOKEN|YAML_STREAM_END_TOKEN)) {
    if ((0x2c0000U >> (yVar1 & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0) {
      if ((0x100010U >> (yVar1 & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0)
      goto LAB_00102b12;
      free((token->data).tag.handle);
      lStack_10 = 0x10;
    }
    else {
      lStack_10 = 8;
    }
    free(*(void **)((long)&token->type + lStack_10));
  }
LAB_00102b12:
  (token->end_mark).line = 0;
  (token->end_mark).column = 0;
  (token->start_mark).column = 0;
  (token->end_mark).index = 0;
  (token->start_mark).index = 0;
  (token->start_mark).line = 0;
  (token->data).tag.suffix = (yaml_char_t *)0x0;
  *(undefined8 *)((long)&token->data + 0x10) = 0;
  *(undefined8 *)token = 0;
  (token->data).tag.handle = (yaml_char_t *)0x0;
  return;
}

Assistant:

YAML_DECLARE(void)
yaml_token_delete(yaml_token_t *token)
{
    assert(token);  /* Non-NULL token object expected. */

    switch (token->type)
    {
        case YAML_TAG_DIRECTIVE_TOKEN:
            yaml_free(token->data.tag_directive.handle);
            yaml_free(token->data.tag_directive.prefix);
            break;

        case YAML_ALIAS_TOKEN:
            yaml_free(token->data.alias.value);
            break;

        case YAML_ANCHOR_TOKEN:
            yaml_free(token->data.anchor.value);
            break;

        case YAML_TAG_TOKEN:
            yaml_free(token->data.tag.handle);
            yaml_free(token->data.tag.suffix);
            break;

        case YAML_SCALAR_TOKEN:
            yaml_free(token->data.scalar.value);
            break;

        default:
            break;
    }

    memset(token, 0, sizeof(yaml_token_t));
}